

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::ruby::Generator::Generate
          (Generator *this,FileDescriptor *file,string *parameter,
          GeneratorContext *generator_context,string *error)

{
  bool bVar1;
  Syntax SVar2;
  int iVar3;
  string *proto_file;
  undefined4 extraout_var;
  pointer output_00;
  undefined1 local_110 [8];
  Printer printer;
  string local_60;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  local_40;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  output;
  string *error_local;
  GeneratorContext *generator_context_local;
  string *parameter_local;
  FileDescriptor *file_local;
  Generator *this_local;
  
  output._M_t.
  super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  .super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>._M_head_impl =
       (__uniq_ptr_data<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,_true,_true>
        )(__uniq_ptr_data<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,_true,_true>
          )error;
  SVar2 = FileDescriptor::syntax(file);
  if ((SVar2 != SYNTAX_PROTO3) && (SVar2 = FileDescriptor::syntax(file), SVar2 != SYNTAX_PROTO2)) {
    std::__cxx11::string::operator=
              ((string *)
               output._M_t.
               super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
               .super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>.
               _M_head_impl,"Invalid or unsupported proto syntax");
    return false;
  }
  proto_file = FileDescriptor::name_abi_cxx11_(file);
  GetOutputFilename(&local_60,proto_file);
  iVar3 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,&local_60);
  std::
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
  ::unique_ptr<std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,void>
            ((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
              *)&local_40,(pointer)CONCAT44(extraout_var,iVar3));
  std::__cxx11::string::~string((string *)&local_60);
  output_00 = std::
              unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
              ::get(&local_40);
  io::Printer::Printer((Printer *)local_110,output_00,'$');
  bVar1 = GenerateFile(file,(Printer *)local_110,
                       (string *)
                       output._M_t.
                       super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                       .super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>.
                       _M_head_impl);
  io::Printer::~Printer((Printer *)local_110);
  std::
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  ::~unique_ptr(&local_40);
  return bVar1;
}

Assistant:

bool Generator::Generate(
    const FileDescriptor* file,
    const std::string& parameter,
    GeneratorContext* generator_context,
    std::string* error) const {

  if (file->syntax() != FileDescriptor::SYNTAX_PROTO3 &&
      file->syntax() != FileDescriptor::SYNTAX_PROTO2) {
    *error = "Invalid or unsupported proto syntax";
    return false;
  }

  std::unique_ptr<io::ZeroCopyOutputStream> output(
      generator_context->Open(GetOutputFilename(file->name())));
  io::Printer printer(output.get(), '$');

  return GenerateFile(file, &printer, error);
}